

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  xmlParserErrors code;
  ulong uVar9;
  ulong uVar10;
  xmlCharEncoding enc;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  xmlCharEncodingHandlerPtr handler_00;
  xmlCharEncodingHandlerPtr handler;
  int inlen;
  xmlChar out [200];
  xmlCharEncodingHandler *local_f8;
  int local_f0;
  undefined4 local_ec;
  byte local_e8 [200];
  
  iVar8 = xmlParserGrow(ctxt);
  if (iVar8 < 0) {
    return;
  }
  pxVar3 = ctxt->input;
  pbVar4 = pxVar3->cur;
  if ((long)pxVar3->end - (long)pbVar4 < 4) {
    return;
  }
  bVar1 = *pbVar4;
  if ((pxVar3->flags & 1U) != 0) {
    if (bVar1 != 0xef) {
      return;
    }
    if (pbVar4[1] != 0xbb) {
      return;
    }
    if (pbVar4[2] != 0xbf) {
      return;
    }
    pxVar3->cur = pbVar4 + 3;
    return;
  }
  bVar5 = true;
  if (bVar1 < 0xef) {
    if (bVar1 == 0) {
      if ((((ctxt->html == 0) && (pbVar4[1] == 0)) && (pbVar4[2] == 0)) && (pbVar4[3] == 0x3c)) {
        enc = XML_CHAR_ENCODING_UCS4BE;
LAB_0014583e:
        uVar11 = 8;
      }
      else {
        if (((pbVar4[1] != 0x3c) || (pbVar4[2] != 0)) || (pbVar4[3] != 0x3f)) goto LAB_001455dd;
        enc = XML_CHAR_ENCODING_UTF16BE;
        uVar11 = 6;
      }
LAB_00145844:
      bVar6 = false;
      lVar12 = 0;
LAB_001455b2:
      bVar5 = false;
      bVar7 = false;
      goto LAB_001455e8;
    }
    if (bVar1 == 0x3c) {
      if (pbVar4[1] == 0) {
        if (((ctxt->html == 0) && (pbVar4[2] == 0)) && (pbVar4[3] == 0)) {
          enc = XML_CHAR_ENCODING_UCS4LE;
          goto LAB_0014583e;
        }
        if ((pbVar4[2] == 0x3f) && (pbVar4[3] == 0)) {
          enc = XML_CHAR_ENCODING_UTF16LE;
          uVar11 = 4;
          goto LAB_00145844;
        }
      }
    }
    else if ((((bVar1 == 0x4c) && (ctxt->html == 0)) && (pbVar4[1] == 0x6f)) &&
            ((pbVar4[2] == 0xa7 && (pbVar4[3] == 0x94)))) {
      enc = XML_CHAR_ENCODING_EBCDIC;
      bVar7 = true;
      uVar11 = 8;
      bVar6 = false;
      lVar12 = 0;
      bVar5 = false;
      goto LAB_001455e8;
    }
  }
  else {
    if (bVar1 == 0xef) {
      if ((pbVar4[1] != 0xbb) || (pbVar4[2] != 0xbf)) goto LAB_001455dd;
      enc = XML_CHAR_ENCODING_UTF8;
      uVar11 = 2;
      lVar12 = 3;
LAB_001455af:
      bVar6 = true;
      goto LAB_001455b2;
    }
    if (bVar1 == 0xfe) {
      if (pbVar4[1] == 0xff) {
        enc = XML_CHAR_ENCODING_UTF16BE;
        uVar11 = 6;
        goto LAB_001455a9;
      }
    }
    else if ((bVar1 == 0xff) && (pbVar4[1] == 0xfe)) {
      enc = XML_CHAR_ENCODING_UTF16LE;
      uVar11 = 4;
LAB_001455a9:
      lVar12 = 2;
      goto LAB_001455af;
    }
  }
LAB_001455dd:
  bVar6 = false;
  lVar12 = 0;
  uVar11 = 0;
  bVar7 = false;
  enc = XML_CHAR_ENCODING_NONE;
LAB_001455e8:
  if (bVar6) {
    pxVar3->cur = pbVar4 + lVar12;
  }
  if (!bVar5) {
    pxVar3->flags = uVar11 | pxVar3->flags;
    if (!bVar7) {
      xmlSwitchEncoding(ctxt,enc);
      return;
    }
    code = xmlCreateCharEncodingHandler("IBM037",0,ctxt->convImpl,ctxt->convCtxt,&local_f8);
    handler_00 = (xmlCharEncodingHandlerPtr)0x0;
    if (code == XML_ERR_OK) {
      local_f0 = 199;
      local_ec = *(int *)&pxVar3->end - (int)pxVar3->cur;
      iVar8 = xmlEncInputChunk(local_f8,local_e8,&local_f0,pxVar3->cur,&local_ec);
      if ((iVar8 < 0) || (local_e8[local_f0] = 0, (long)local_f0 < 1)) {
        handler_00 = (xmlCharEncodingHandlerPtr)0x0;
      }
      else {
        handler_00 = (xmlCharEncodingHandlerPtr)0x0;
        lVar12 = 0;
        do {
          if (local_e8[lVar12] == 0x65) {
            iVar8 = xmlStrncmp(local_e8 + lVar12,"encoding",8);
            if (iVar8 == 0) {
              uVar13 = lVar12 + 10;
              goto LAB_00145742;
            }
          }
          else if (local_e8[lVar12] == 0x3e) break;
          lVar12 = lVar12 + 1;
        } while (lVar12 < local_f0);
      }
LAB_001456d8:
      xmlCharEncCloseFunc(local_f8);
      code = xmlCreateCharEncodingHandler("IBM037",0,ctxt->convImpl,ctxt->convCtxt,&local_f8);
      if (code == XML_ERR_OK) {
        handler_00 = local_f8;
      }
    }
LAB_0014570a:
    if (code == XML_ERR_OK) {
      xmlSwitchToEncoding(ctxt,handler_00);
    }
    else {
      xmlFatalErr(ctxt,code,"detecting EBCDIC\n");
    }
  }
  return;
LAB_00145742:
  uVar9 = (ulong)local_e8[uVar13 - 2];
  code = (xmlParserErrors)local_e8[uVar13 - 2];
  if (0x3d < uVar9) goto LAB_00145825;
  if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
    if (uVar9 == 0x3d) goto LAB_00145767;
    goto LAB_00145825;
  }
  uVar13 = uVar13 + 1;
  goto LAB_00145742;
LAB_00145767:
  bVar1 = local_e8[uVar13 - 1];
  uVar9 = (ulong)bVar1;
  code = (xmlParserErrors)bVar1;
  if (0x27 < uVar9) goto LAB_00145825;
  if ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0) goto code_r0x0014577d;
  if ((0x8400000000U >> (uVar9 & 0x3f) & 1) == 0) goto LAB_00145825;
  uVar10 = (ulong)(int)uVar13;
  uVar9 = uVar13 & 0xffffffff;
  while (((bVar2 = local_e8[uVar9], (byte)(bVar2 - 0x30) < 10 ||
          ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
         ((bVar2 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))))
        ) {
    uVar10 = uVar10 + 1;
    uVar9 = uVar10;
  }
  if (bVar2 == bVar1) {
    local_e8[uVar10 & 0xffffffff] = 0;
    xmlCharEncCloseFunc(local_f8);
    bVar5 = false;
    code = xmlCreateCharEncodingHandler
                     ((char *)(local_e8 + (uVar13 & 0xffffffff)),0,ctxt->convImpl,ctxt->convCtxt,
                      &local_f8);
    handler_00 = local_f8;
    if (code != XML_ERR_OK) {
      handler_00 = (xmlCharEncodingHandlerPtr)0x0;
    }
  }
  else {
LAB_00145825:
    bVar5 = true;
    handler_00 = (xmlCharEncodingHandlerPtr)0x0;
  }
  if (bVar5) goto LAB_001456d8;
  goto LAB_0014570a;
code_r0x0014577d:
  uVar13 = uVar13 + 1;
  goto LAB_00145767;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            int res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}